

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ClientSession::on_session_offer(ClientSession *this)

{
  uint16_t uVar1;
  rep rVar2;
  rep rVar3;
  undefined8 uVar4;
  undefined1 local_c8 [8];
  SessionAccept accept;
  duration<long,_std::ratio<1L,_1000L>_> local_a8;
  long local_a0;
  long milliseconds;
  duration<long,_std::ratio<1L,_1L>_> local_90;
  rep local_88;
  rep timestamp;
  time_point now;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  duration<long,_std::ratio<1L,_1L>_> local_68;
  uint local_5c;
  parse_error *e;
  SessionOffer local_40;
  undefined1 local_28 [8];
  SessionOffer offer;
  ClientSession *this_local;
  
  offer._16_8_ = this;
  control::SessionOffer::SessionOffer((SessionOffer *)local_28,0,0,0);
  Session::read_data<ki::protocol::control::SessionOffer>
            (&local_40,
             (Session *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]));
  control::SessionOffer::operator=((SessionOffer *)local_28,&local_40);
  control::SessionOffer::~SessionOffer(&local_40);
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_70.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&now,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)(&this->field_0x18 + (long)this->_vptr_ClientSession[-3]
                                            ));
  local_68.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_70);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_68);
  if (rVar2 < 4) {
    timestamp = std::chrono::_V2::system_clock::now();
    milliseconds = (long)std::chrono::
                         time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                             *)&timestamp);
    local_90.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&milliseconds);
    local_88 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_90);
    accept._16_8_ =
         std::chrono::
         time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&timestamp);
    local_a8.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   &accept.m_milliseconds);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a8);
    local_a0 = rVar3 + local_88 * -1000;
    uVar1 = control::SessionOffer::get_session_id((SessionOffer *)local_28);
    *(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ClientSession[-3]) = uVar1;
    control::SessionAccept::SessionAccept
              ((SessionAccept *)local_c8,
               *(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ClientSession[-3]),
               (int32_t)local_88,(uint32_t)local_a0);
    Session::send_packet
              ((Session *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),
               true,'\x05',(Serializable *)local_c8);
    (&this->field_0xa)[(long)this->_vptr_ClientSession[-3]] = 1;
    uVar4 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(&this->field_0x20 + (long)this->_vptr_ClientSession[-3]) = uVar4;
    *(undefined8 *)(&this->field_0x28 + (long)this->_vptr_ClientSession[-3]) =
         *(undefined8 *)(&this->field_0x20 + (long)this->_vptr_ClientSession[-3]);
    (*this->_vptr_ClientSession[3])();
    control::SessionAccept::~SessionAccept((SessionAccept *)local_c8);
  }
  else {
    (**(code **)(*(long *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]) +
                0x38))((_func_int *)
                       ((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),7);
  }
  local_5c = (uint)(rVar2 >= 4);
  control::SessionOffer::~SessionOffer((SessionOffer *)local_28);
  return;
}

Assistant:

void ClientSession::on_session_offer()
	{
		// Read the payload data into a structure
		control::SessionOffer offer;
		try
		{
			offer = read_data<control::SessionOffer>();
		}
		catch (parse_error &e)
		{
			// The SESSION_OFFER wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Should this session have already timed out?
		if (std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_connection_time
			).count() > KI_CONNECTION_TIMEOUT)
		{
			close(SessionCloseErrorCode::SESSION_OFFER_TIMED_OUT);
			return;
		}

		// Work out the current timestamp and how many milliseconds 
		// have elapsed in the current second. 
		auto now = std::chrono::system_clock::now();
		const auto timestamp = std::chrono::duration_cast<std::chrono::seconds>(
			now.time_since_epoch()
		).count();
		const auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(
			now.time_since_epoch()
		).count() - (timestamp * 1000);

		// Accept the session
		m_id = offer.get_session_id();
		control::SessionAccept accept(m_id, timestamp, milliseconds);
		send_packet(true, (uint8_t)control::Opcode::SESSION_ACCEPT, accept);

		// The session is successfully established
		m_established = true;
		m_establish_time = std::chrono::steady_clock::now();
		m_last_received_heartbeat_time = m_establish_time;
		on_established();
	}